

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_file_tests.cpp
# Opt level: O1

void FileSystemTest::SetUpTestCase(void)

{
  char *in_R9;
  AssertionResult iutest_ar;
  allocator<char> local_211;
  string local_210;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0;
  undefined7 uStack_1df;
  char local_1d0;
  AssertionHelper local_1c8;
  undefined1 local_198 [392];
  
  std::filesystem::__cxx11::path::path<char[21],std::filesystem::__cxx11::path>
            ((path *)local_198,(char (*) [21])"./testdata/empty.bin",auto_format);
  local_1d0 = std::filesystem::copy_file((path *)local_198,&largefile_abi_cxx11_,overwrite_existing)
  ;
  local_1e8 = 0;
  local_1e0 = 0;
  local_1f0 = &local_1e0;
  std::filesystem::__cxx11::path::~path((path *)local_198);
  if (local_1d0 == '\0') {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_210,(internal *)&local_1f0,
               (AssertionResult *)
               "::std::filesystem::copy_file(\"./testdata/empty.bin\", largefile, ::std::filesystem::copy_options::overwrite_existing)"
               ,"false","true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,local_210._M_dataplus._M_p,&local_211);
    local_1c8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
    ;
    local_1c8.m_part_result.super_iuCodeMessage.m_line = 0x54;
    local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
  }
  return;
}

Assistant:

static void SetUpTestCase(void)
    {
        IUTEST_ASSERT_TRUE(::std::filesystem::copy_file("./testdata/empty.bin", largefile, ::std::filesystem::copy_options::overwrite_existing));
    }